

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.h
# Opt level: O0

void __thiscall
lf::refinement::MeshHierarchy::
MarkEdges<std::function<bool(lf::mesh::Mesh_const&,lf::mesh::Entity_const&)>const&>
          (MeshHierarchy *this,
          function<bool_(const_lf::mesh::Mesh_&,_const_lf::mesh::Entity_&)> *marker)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  __shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  reference pvVar4;
  size_type sVar5;
  runtime_error *this_01;
  undefined4 extraout_var;
  reference ppEVar6;
  reference local_270;
  uint local_25c;
  Entity *pEStack_258;
  glb_idx_t edge_index;
  Entity *edge;
  iterator __end2;
  iterator __begin2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  element_type *local_20;
  Mesh *finest_mesh;
  function<bool_(const_lf::mesh::Mesh_&,_const_lf::mesh::Entity_&)> *marker_local;
  MeshHierarchy *this_local;
  
  finest_mesh = (Mesh *)marker;
  marker_local = (function<bool_(const_lf::mesh::Mesh_&,_const_lf::mesh::Entity_&)> *)this;
  this_00 = (__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
            ::back(&this->meshes_);
  local_20 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(this_00);
  pvVar4 = std::
           vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ::back(&this->edge_marked_);
  sVar5 = std::vector<bool,_std::allocator<bool>_>::size(pvVar4);
  uVar2 = (*local_20->_vptr_Mesh[3])(local_20,1);
  if (sVar5 != uVar2) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"Length  mismatch for edge flag array");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"edge_marked_.back().size() == finest_mesh.NumEntities(1)",
               &local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x1cc,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"this code should not be reached");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = (*local_20->_vptr_Mesh[2])(local_20,1);
  __begin2._M_current = (Entity **)CONCAT44(extraout_var,iVar3);
  __end2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  edge = (Entity *)
         std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                   ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end2,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                *)&edge);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar6 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end2);
    pEStack_258 = *ppEVar6;
    local_25c = (*local_20->_vptr_Mesh[5])(local_20,pEStack_258);
    bVar1 = std::function<bool_(const_lf::mesh::Mesh_&,_const_lf::mesh::Entity_&)>::operator()
                      ((function<bool_(const_lf::mesh::Mesh_&,_const_lf::mesh::Entity_&)> *)
                       finest_mesh,local_20,pEStack_258);
    pvVar4 = std::
             vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ::back(&this->edge_marked_);
    local_270 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar4,(ulong)local_25c);
    std::_Bit_reference::operator=(&local_270,bVar1);
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void MeshHierarchy::MarkEdges(Marker &&marker) {
  // Retrieve the finest mesh in the hierarchy
  const mesh::Mesh &finest_mesh(*meshes_.back());

  LF_VERIFY_MSG(edge_marked_.back().size() == finest_mesh.NumEntities(1),
                "Length  mismatch for edge flag array");

  // Run through the edges = entities of co-dimension 1
  for (const mesh::Entity *edge : finest_mesh.Entities(1)) {
    const glb_idx_t edge_index = finest_mesh.Index(*edge);
    (edge_marked_.back())[edge_index] = marker(finest_mesh, *edge);
  }
}